

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O1

void __thiscall
QuickConnection::QuickConnection
          (QuickConnection *this,QuickCallback *quick_cb,ProcessThread *thread,UdpSocket *socket,
          uint32_t session_id,string *dst_ip,uint16_t dst_port,bool connected,AckThread *ack_thread)

{
  unique_ptr<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_> *this_00;
  pointer pcVar1;
  uchar *puVar2;
  QuicClock *pQVar3;
  QuicConnectionStats *pQVar4;
  RttStats *pRVar5;
  _Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false> __ptr_00;
  SendAlgorithmInterface *pSVar6;
  ProcessThread *pPVar7;
  long lVar8;
  uchar *puVar9;
  RingBuffer<QuickPacket> *this_01;
  QuicClock *this_02;
  QuicConnectionStats *pQVar10;
  RttStats *this_03;
  _Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false> this_04;
  SendAlgorithmInterface *pSVar11;
  PacingSender *this_05;
  long *plVar12;
  pointer *__ptr;
  
  (this->super_Module)._vptr_Module = (_func_int **)&PTR_TimeUntilNextProcess_0012f688;
  this->_session_id = session_id;
  (this->_dst_ip)._M_dataplus._M_p = (pointer)&(this->_dst_ip).field_2;
  pcVar1 = (dst_ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_dst_ip,pcVar1,pcVar1 + dst_ip->_M_string_length);
  this->_dst_port = dst_port;
  this->_socket = socket;
  this->_thread = thread;
  (this->_repeating_task)._repeating_task = (RepeatingTaskBase *)0x0;
  this->_ack_thread = ack_thread;
  this->_repeating_task_interval_ms = 0x14;
  this->_server_state = connected;
  this_00 = &this->_unacked_packet_map;
  this->_expect_recv_sequence_number = 0;
  (this->_send_buf)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  (this->_send_algorithm)._M_t.
  super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
  .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl =
       (SendAlgorithmInterface *)0x0;
  (this->_pacing_sender)._M_t.
  super___uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>._M_t.
  super__Tuple_impl<0UL,_quic::PacingSender_*,_std::default_delete<quic::PacingSender>_>.
  super__Head_base<0UL,_quic::PacingSender_*,_false>._M_head_impl = (PacingSender *)0x0;
  (this->_clock)._M_t.super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>.
  _M_t.super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
  super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl = (QuicClock *)0x0;
  (this->_rtt_stats)._M_t.
  super___uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>._M_t.
  super__Tuple_impl<0UL,_quic::RttStats_*,_std::default_delete<quic::RttStats>_>.
  super__Head_base<0UL,_quic::RttStats_*,_false>._M_head_impl = (RttStats *)0x0;
  (this->_connection_stats)._M_t.
  super___uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>.
  _M_t.
  super__Tuple_impl<0UL,_quic::QuicConnectionStats_*,_std::default_delete<quic::QuicConnectionStats>_>
  .super__Head_base<0UL,_quic::QuicConnectionStats_*,_false>._M_head_impl =
       (QuicConnectionStats *)0x0;
  (this->_wait_send_packets)._M_t.
  super___uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_RingBuffer<QuickPacket>_*,_std::default_delete<RingBuffer<QuickPacket>_>_>.
  super__Head_base<0UL,_RingBuffer<QuickPacket>_*,_false>._M_head_impl =
       (RingBuffer<QuickPacket> *)0x0;
  (this->_unacked_packet_map)._M_t.
  super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
  .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl =
       (QuicUnackedPacketMap *)0x0;
  this->_sequence_number = 0;
  this->_packet_number = 0;
  (this->_packets_acked).super__Vector_base<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_packets_acked).super__Vector_base<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_packets_acked).super__Vector_base<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_packets_lost).super__Vector_base<quic::LostPacket,_std::allocator<quic::LostPacket>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_packets_lost).super__Vector_base<quic::LostPacket,_std::allocator<quic::LostPacket>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_packets_lost).super__Vector_base<quic::LostPacket,_std::allocator<quic::LostPacket>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_rtt_updated = false;
  lVar8 = 0xe0;
  do {
    *(undefined8 *)((long)&(this->super_Module)._vptr_Module + lVar8) = 0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x800e0);
  this->_quick_cb = quick_cb;
  this->_retransmission_packet_timeout_us = 1000000;
  (this->_wait_retransmission_packets).
  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_wait_retransmission_packets;
  (this->_wait_retransmission_packets).
  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_wait_retransmission_packets;
  (this->_wait_retransmission_packets).
  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node._M_size = 0;
  this->_wait_process_infinite = false;
  this->_total_acked_bytes = 0;
  this->_prior_total_acked_bytes = 0;
  this->_print_acked_bytes_us = 0;
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  this->_latest_received_ack_time = 0;
  this->_acked_rate = 0;
  this->_prior_receive_ack_time = 0;
  this->_prior_sent_time = 0;
  this->_need_reconnect = true;
  this->_reconnect_time = 0;
  this->_latest_send_msg_time = 0;
  this->_latest_recv_msg_time = 0;
  (this->_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_send_packets_len;
  (this->_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_send_packets_len;
  (this->_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  this->_total_send_len = 0;
  (this->_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_recv_packets_len;
  (this->_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_recv_packets_len;
  (this->_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  this->_total_recv_len = 0;
  (this->_acked_packets_len).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_acked_packets_len;
  (this->_acked_packets_len).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_acked_packets_len;
  (this->_acked_packets_len).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl._M_node._M_size = 0;
  (this->_real_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_real_send_packets_len;
  (this->_real_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_real_send_packets_len;
  (this->_real_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  (this->_real_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_real_recv_packets_len;
  (this->_real_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_real_recv_packets_len;
  (this->_real_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  if (this->_server_state == true) {
    this->_need_reconnect = false;
  }
  AckThread::AddSession(this->_ack_thread,this->_session_id,&this->_dst_ip,this->_dst_port);
  puVar9 = (uchar *)operator_new__(0x800);
  puVar2 = (this->_send_buf)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->_send_buf)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar9;
  if (puVar2 != (uchar *)0x0) {
    operator_delete(puVar2,1);
  }
  if (this->_server_state == false) {
    ConnectToServer(this);
  }
  this_01 = (RingBuffer<QuickPacket> *)operator_new(0x18);
  RingBuffer<QuickPacket>::RingBuffer(this_01,1000);
  std::__uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>::
  reset((__uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_> *)
        &this->_wait_send_packets,this_01);
  this_02 = (QuicClock *)operator_new(0x18);
  this_02->_vptr_QuicClock = (_func_int **)0x0;
  *(undefined8 *)&this_02->is_calibrated_ = 0;
  (this_02->calibration_offset_).time_offset_ = 0;
  quic::QuicClock::QuicClock(this_02);
  this_02->_vptr_QuicClock = (_func_int **)&PTR__QuicClock_0012f830;
  pQVar3 = (this->_clock)._M_t.
           super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
           super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
           super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl;
  (this->_clock)._M_t.super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>.
  _M_t.super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
  super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl = this_02;
  if (pQVar3 != (QuicClock *)0x0) {
    (*pQVar3->_vptr_QuicClock[1])();
  }
  pQVar10 = (QuicConnectionStats *)operator_new(0x30);
  (pQVar10->slowstart_duration).total_elapsed_.time_offset_ = 0;
  pQVar10->bbr_num_cycles = 0;
  pQVar10->bbr_num_short_cycles_for_reno_coexistence = 0;
  pQVar10->num_ack_aggregation_epochs = 0;
  pQVar10->slowstart_count = 0;
  (pQVar10->slowstart_duration).last_start_time_.time_ = 0x7fffffffffffffff;
  pQVar10->bbr_exit_startup_due_to_loss = false;
  pQVar4 = (this->_connection_stats)._M_t.
           super___uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>
           ._M_t.
           super__Tuple_impl<0UL,_quic::QuicConnectionStats_*,_std::default_delete<quic::QuicConnectionStats>_>
           .super__Head_base<0UL,_quic::QuicConnectionStats_*,_false>._M_head_impl;
  (this->_connection_stats)._M_t.
  super___uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>.
  _M_t.
  super__Tuple_impl<0UL,_quic::QuicConnectionStats_*,_std::default_delete<quic::QuicConnectionStats>_>
  .super__Head_base<0UL,_quic::QuicConnectionStats_*,_false>._M_head_impl = pQVar10;
  if (pQVar4 != (QuicConnectionStats *)0x0) {
    operator_delete(pQVar4,0x30);
  }
  this_03 = (RttStats *)operator_new(0x60);
  quic::RttStats::RttStats(this_03);
  pRVar5 = (this->_rtt_stats)._M_t.
           super___uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>._M_t.
           super__Tuple_impl<0UL,_quic::RttStats_*,_std::default_delete<quic::RttStats>_>.
           super__Head_base<0UL,_quic::RttStats_*,_false>._M_head_impl;
  (this->_rtt_stats)._M_t.
  super___uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>._M_t.
  super__Tuple_impl<0UL,_quic::RttStats_*,_std::default_delete<quic::RttStats>_>.
  super__Head_base<0UL,_quic::RttStats_*,_false>._M_head_impl = this_03;
  if (pRVar5 != (RttStats *)0x0) {
    operator_delete(pRVar5,0x60);
  }
  this_04._M_head_impl = (QuicUnackedPacketMap *)operator_new(0x2c0020);
  quic::QuicUnackedPacketMap::QuicUnackedPacketMap(this_04._M_head_impl);
  __ptr_00._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
       ._M_t.
       super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
       .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
  .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl = this_04._M_head_impl;
  if (__ptr_00._M_head_impl != (QuicUnackedPacketMap *)0x0) {
    std::default_delete<quic::QuicUnackedPacketMap>::operator()
              ((default_delete<quic::QuicUnackedPacketMap> *)this_00,__ptr_00._M_head_impl);
  }
  pSVar11 = quic::SendAlgorithmInterface::Create
                      ((this->_clock)._M_t.
                       super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>
                       .super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl,
                       (this->_rtt_stats)._M_t.
                       super___uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_quic::RttStats_*,_std::default_delete<quic::RttStats>_>
                       .super__Head_base<0UL,_quic::RttStats_*,_false>._M_head_impl,
                       (this->_unacked_packet_map)._M_t.
                       super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
                       .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl,
                       kBBRv2,(this->_connection_stats)._M_t.
                              super___uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_quic::QuicConnectionStats_*,_std::default_delete<quic::QuicConnectionStats>_>
                              .super__Head_base<0UL,_quic::QuicConnectionStats_*,_false>.
                              _M_head_impl,0x20);
  pSVar6 = (this->_send_algorithm)._M_t.
           super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
           .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl;
  (this->_send_algorithm)._M_t.
  super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
  .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl = pSVar11;
  if (pSVar6 != (SendAlgorithmInterface *)0x0) {
    (*pSVar6->_vptr_SendAlgorithmInterface[1])();
  }
  this_05 = (PacingSender *)operator_new(0x40);
  quic::PacingSender::PacingSender(this_05);
  std::__uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>::reset
            ((__uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_> *)
             &this->_pacing_sender,this_05);
  quic::PacingSender::set_sender
            ((this->_pacing_sender)._M_t.
             super___uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>.
             _M_t.
             super__Tuple_impl<0UL,_quic::PacingSender_*,_std::default_delete<quic::PacingSender>_>.
             super__Head_base<0UL,_quic::PacingSender_*,_false>._M_head_impl,
             (this->_send_algorithm)._M_t.
             super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
             .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl);
  (*(this->_thread->super_TaskQueueBase)._vptr_TaskQueueBase[8])(this->_thread,this);
  (*(this->_thread->super_TaskQueueBase)._vptr_TaskQueueBase[7])(this->_thread,this);
  pPVar7 = this->_thread;
  plVar12 = (long *)operator_new(0x10);
  *plVar12 = (long)&PTR__QueuedTask_0012f6d8;
  plVar12[1] = (long)this;
  (*(pPVar7->super_TaskQueueBase)._vptr_TaskQueueBase[1])(pPVar7);
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 8))();
  }
  return;
}

Assistant:

QuickConnection::QuickConnection(QuickCallback* quick_cb, dd::ProcessThread *thread, UdpSocket* socket, 
	uint32_t session_id, const std::string &dst_ip, uint16_t dst_port, bool connected, AckThread* ack_thread)
	: _quick_cb(quick_cb), _thread(thread), _socket(socket), _session_id(session_id), _dst_ip(dst_ip), _dst_port(dst_port), _server_state(connected)
	,_ack_thread(ack_thread)
{
	if (_server_state)
		_need_reconnect = false;
	_ack_thread->AddSession(_session_id, _dst_ip, _dst_port);
	_send_buf.reset(new uint8_t[SEND_BUF_LEN]);
	if (!_server_state)
		ConnectToServer();
	_wait_send_packets.reset(new RingBuffer<QuickPacket>(1000));
	_clock.reset(new quic::QuicClockImpl());
	_connection_stats.reset(new quic::QuicConnectionStats);
	_rtt_stats.reset(new quic::RttStats);
	_unacked_packet_map.reset(new quic::QuicUnackedPacketMap);
	_send_algorithm.reset(quic::SendAlgorithmInterface::Create(_clock.get(),
		_rtt_stats.get(),
		_unacked_packet_map.get(),
		quic::kBBRv2,
		_connection_stats.get(),
		32));

	_pacing_sender.reset(new quic::PacingSender);
	_pacing_sender->set_sender(_send_algorithm.get());

	_thread->RegisterModule(this, dd::RTC_FROM_HERE);
	_thread->WakeUp(this);

	PostTask([this] {
		_repeating_task = dd::RepeatingTaskHandle::DelayedStart(_thread->Current(), _repeating_task_interval_ms, [this] {
			if(!_server_state && _need_reconnect)
				TryReconnectServer();
			TrySendHeartbeat();
			MaybeWakeupProcess();
			PickTimeoutUnackedPackets();
			if (_clock->Now().ToDebuggingValue() - _print_acked_bytes_us >= 1000000) {
				_print_acked_bytes_us = _clock->Now().ToDebuggingValue();
				char buf[256] = { 0 };
				float speed = _total_acked_bytes - _prior_total_acked_bytes;
				speed = speed / 1024.0 / 1024.0;
#ifdef OUTPUT_DEBUG_INFO
				dd::OutputDebugInfo("%llu acked: %f Mbyte/s, acked_rate = %llu\r\n", _print_acked_bytes_us, speed, _acked_rate);
#endif
				_prior_total_acked_bytes = _total_acked_bytes;
			}
			return _repeating_task_interval_ms;
		});
	});
}